

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeTableCopy
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name destTable,Name srcTable)

{
  Name sourceTable;
  Name destTable_00;
  TableCopy *pTVar1;
  bool bVar2;
  Ok local_109;
  IRBuilder *local_108;
  size_t local_100;
  char *local_f8;
  char *local_f0;
  uint local_e4;
  Err local_e0;
  Err *local_b0;
  Err *err;
  Result<wasm::Ok> _val;
  TableCopy curr;
  IRBuilder *this_local;
  Name srcTable_local;
  Name destTable_local;
  
  srcTable_local.super_IString.str._M_len = srcTable.super_IString.str._M_str;
  this_local = srcTable.super_IString.str._M_len;
  srcTable_local.super_IString.str._M_str = destTable.super_IString.str._M_len;
  pTVar1 = (TableCopy *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  curr.sourceTable.super_IString.str._M_str = (char *)this;
  TableCopy::TableCopy(pTVar1);
  wasm::Name::operator=((Name *)&curr.size,(Name *)&srcTable_local.super_IString.str._M_str);
  wasm::Name::operator=((Name *)&curr.destTable.super_IString.str._M_str,(Name *)&this_local);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitTableCopy
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pTVar1);
  local_b0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar2 = local_b0 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_e0,local_b0);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_e0);
    wasm::Err::~Err(&local_e0);
  }
  local_e4 = (uint)bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_e4 == 0) {
    local_f8 = srcTable_local.super_IString.str._M_str;
    local_108 = this_local;
    local_100 = srcTable_local.super_IString.str._M_len;
    destTable_00.super_IString.str._M_str = destTable.super_IString.str._M_str;
    destTable_00.super_IString.str._M_len = (size_t)srcTable_local.super_IString.str._M_str;
    sourceTable.super_IString.str._M_str = (char *)srcTable_local.super_IString.str._M_len;
    sourceTable.super_IString.str._M_len = (size_t)this_local;
    local_f0 = destTable.super_IString.str._M_str;
    pTVar1 = Builder::makeTableCopy
                       (&this->builder,
                        (Expression *)
                        curr.super_SpecificExpression<(wasm::Expression::Id)50>.super_Expression.
                        type.id,curr.dest,curr.source,destTable_00,sourceTable);
    push(this,(Expression *)pTVar1);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_109);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeTableCopy(Name destTable, Name srcTable) {
  TableCopy curr;
  curr.destTable = destTable;
  curr.sourceTable = srcTable;
  CHECK_ERR(visitTableCopy(&curr));
  push(builder.makeTableCopy(
    curr.dest, curr.source, curr.size, destTable, srcTable));
  return Ok{};
}